

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void deqp::gls::ShaderExecUtil::checkExtension(RenderContext *renderCtx,string *extension)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *this;
  int numExts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long lVar4;
  
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_40._M_dataplus._M_p._0_4_ = 0;
  (**(code **)(lVar4 + 0x868))(0x821d,&local_40);
  bVar1 = 0 < (int)local_40._M_dataplus._M_p;
  if (0 < (int)local_40._M_dataplus._M_p) {
    (**(code **)(lVar4 + 0xa80))(0x1f03,0);
    iVar2 = std::__cxx11::string::compare((char *)extension);
    if (iVar2 != 0) {
      iVar2 = 1;
      do {
        bVar1 = iVar2 < (int)local_40._M_dataplus._M_p;
        if ((int)local_40._M_dataplus._M_p <= iVar2) break;
        (**(code **)(lVar4 + 0xa80))(0x1f03,iVar2);
        iVar3 = std::__cxx11::string::compare((char *)extension);
        iVar2 = iVar2 + 1;
      } while (iVar3 != 0);
    }
  }
  if (bVar1) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::operator+(&local_40,extension," is not supported");
  tcu::NotSupportedError::NotSupportedError(this,&local_40);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkExtension (const glu::RenderContext& renderCtx, const std::string& extension)
{
	if (!isExtensionSupported(renderCtx, extension))
		throw tcu::NotSupportedError(extension + " is not supported");
}